

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  char *zTerm;
  bool bVar1;
  long lVar2;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  Fts3MultiSegReader *pSegcsr;
  Fts3PhraseToken *pToken_1;
  int iCol;
  Fts3PhraseToken *pToken;
  int bIncrOk;
  int bHaveIncr;
  int i;
  int rc;
  Fts3Table *pTab;
  undefined4 local_58;
  uint3 in_stack_ffffffffffffffac;
  uint3 uVar3;
  Fts3Phrase *in_stack_ffffffffffffffb0;
  Fts3Cursor *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Fts3Table *in_stack_ffffffffffffffc8;
  uint local_30;
  int local_28;
  int local_24;
  uint nTerm;
  
  local_24 = 0;
  bVar1 = false;
  nTerm = (uint)in_stack_ffffffffffffffac;
  if (((in_ESI != 0) &&
      (nTerm = (uint)in_stack_ffffffffffffffac,
      *(char *)((long)in_RDI + 0x4c) == *(char *)(*in_RDI + 0x1cf))) &&
     (nTerm = (uint)in_stack_ffffffffffffffac, *(int *)(in_RDX + 0x50) < 5)) {
    nTerm = CONCAT13(0 < *(int *)(in_RDX + 0x50),in_stack_ffffffffffffffac);
  }
  local_30 = nTerm >> 0x18;
  local_28 = 0;
  while( true ) {
    uVar3 = (uint3)(ushort)nTerm;
    if (local_30 == 1) {
      uVar3 = CONCAT12(local_28 < *(int *)(in_RDX + 0x50),(ushort)nTerm);
    }
    nTerm = CONCAT13((char)(nTerm >> 0x18),uVar3);
    if ((char)(uVar3 >> 0x10) == '\0') break;
    in_stack_ffffffffffffffc8 = (Fts3Table *)(in_RDX + 0x58 + (long)local_28 * 0x28);
    if ((*(int *)&(in_stack_ffffffffffffffc8->base).zErrMsg != 0) ||
       ((in_stack_ffffffffffffffc8->zDb != (char *)0x0 &&
        (*(int *)(in_stack_ffffffffffffffc8->zDb + 0x34) == 0)))) {
      local_30 = 0;
    }
    if (in_stack_ffffffffffffffc8->zDb != (char *)0x0) {
      bVar1 = true;
    }
    local_28 = local_28 + 1;
  }
  if ((local_30 == 0) || (!bVar1)) {
    local_24 = fts3EvalPhraseLoad(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    *(undefined4 *)(in_RDX + 0x38) = 0;
  }
  else {
    if (*(int *)(in_RDX + 0x54) < *(int *)(*in_RDI + 0x30)) {
      local_58 = *(undefined4 *)(in_RDX + 0x54);
    }
    else {
      local_58 = 0xffffffff;
    }
    local_28 = 0;
    while( true ) {
      bVar1 = false;
      if (local_24 == 0) {
        bVar1 = local_28 < *(int *)(in_RDX + 0x50);
      }
      if (!bVar1) break;
      lVar2 = in_RDX + 0x58 + (long)local_28 * 0x28;
      zTerm = *(char **)(lVar2 + 0x20);
      if (zTerm != (char *)0x0) {
        local_24 = sqlite3Fts3MsrIncrStart
                             (in_stack_ffffffffffffffc8,
                              (Fts3MultiSegReader *)CONCAT44(local_58,in_stack_ffffffffffffffc0),
                              (int)((ulong)lVar2 >> 0x20),zTerm,nTerm);
      }
      local_28 = local_28 + 1;
    }
    *(undefined4 *)(in_RDX + 0x38) = 1;
  }
  return local_24;
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk
   && pCsr->bDesc==pTab->bDescIdx
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#if defined(SQLITE_DEBUG) || defined(SQLITE_TEST)
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}